

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mainEth1394.cpp
# Opt level: O1

void TestDacRW(BasePort *port,uchar boardNum)

{
  ulong uVar1;
  int iVar2;
  uint uVar3;
  ostream *poVar4;
  ulong uVar5;
  int iVar6;
  long lVar7;
  uint uVar8;
  uint *puVar9;
  long lVar10;
  quadlet_t write_block [6];
  undefined8 local_50;
  uint local_48 [6];
  
  if (boardNum < 0x10) {
    local_50 = port->FirmwareVersion[boardNum];
  }
  else {
    local_50 = 0;
  }
  uVar5 = (ulong)(7 < local_50);
  puVar9 = local_48 + uVar5;
  lVar10 = 1;
  lVar7 = 0x11;
  do {
    *puVar9 = 0;
    iVar2 = (*port->_vptr_BasePort[0x23])(port,(ulong)boardNum,lVar7,puVar9);
    if ((char)iVar2 == '\0') {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Failed to read quadlet for channel ",0x23);
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
    }
    *puVar9 = (uint)(ushort)*puVar9;
    puVar9 = puVar9 + 1;
    lVar10 = lVar10 + 1;
    lVar7 = lVar7 + 0x10;
  } while (lVar10 != 5);
  iVar2 = (7 < local_50) + 5;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Read from DAC: ",0xf);
  *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) =
       *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 8;
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,", ",2);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,", ",2);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,", ",2);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  uVar1 = local_50;
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  if (7 < uVar1) {
    local_48[0] = (uint)boardNum << 0x10 | iVar2 * 0x1000000;
  }
  lVar7 = 0;
  uVar3 = (uint)boardNum << 0x18;
  if (7 < uVar1) {
    uVar3 = 0;
  }
  iVar6 = 0x100;
  do {
    uVar8 = local_48[uVar5 + lVar7] + iVar6;
    local_48[uVar5 + lVar7] =
         (uVar8 | 0x80000000) >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 |
         local_48[uVar5 + lVar7] * 0x1000000 | uVar3;
    lVar7 = lVar7 + 1;
    iVar6 = iVar6 + 0x100;
  } while (lVar7 != 4);
  uVar5 = (ulong)(uint)(iVar2 * 4);
  *(undefined4 *)((uVar5 - 4) + (long)local_48) = 0;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Setting new values",0x12);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
  std::ostream::put(-0x20);
  std::ostream::flush();
  iVar2 = (*port->_vptr_BasePort[0x27])(port,(ulong)boardNum,0,local_48,uVar5);
  if ((char)iVar2 == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Failed to write block data",0x1a);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
    std::ostream::put(-0x20);
    std::ostream::flush();
  }
  return;
}

Assistant:

void TestDacRW(BasePort *port, unsigned char boardNum)
{
    size_t i;
    quadlet_t write_block[6];

    size_t i0 = 0;
    size_t numQuads = 5;
    unsigned long fver = port->GetFirmwareVersion(boardNum);
    if (fver > 7) {
        i0 = 1;
        numQuads = 6;
    }

    // Read from DAC (quadlet reads), modify values, write them using
    // a block write.
    for (i = 0; i < 4; i++) {
        nodeaddr_t addr = 0x0001 | ((i+1) << 4);  // channel 1-4, DAC Control
        write_block[i0+i] = 0;
        if (!port->ReadQuadlet(boardNum, addr, write_block[i0+i]))
            std::cout << "Failed to read quadlet for channel " << (i+1) << std::endl;
        write_block[i0+i] &= 0x0000ffff;
    }
    std::cout << "Read from DAC: " << std::hex << write_block[i0+0] << ", "
              << write_block[i0+1] << ", " << write_block[i0+2] << ", "
              << write_block[i0+3] << std::endl;
    if (fver > 7) {
        write_block[0] = bswap_32(static_cast<quadlet_t>((boardNum << 8) | numQuads));
    }
    for (i = 0; i < 4; i++) {
        write_block[i0+i] = bswap_32(VALID_BIT | (write_block[i0+i]+static_cast<quadlet_t>(i+1)*0x100));
        if (fver < 8)
            write_block[i0+i] |= (boardNum<<24);
    }
    write_block[numQuads-1] = 0;   // power control
    std::cout << "Setting new values" << std::endl;
    if (!port->WriteBlock(boardNum, 0, write_block, numQuads*sizeof(quadlet_t)))
        std::cout << "Failed to write block data" << std::endl;
}